

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

void permute(fdb_kvs_handle *kv,char *a,int l,int r)

{
  void *key;
  size_t metalen;
  uint in_ECX;
  uint in_EDX;
  fdb_kvs_handle *in_RSI;
  fdb_kvs_handle *in_RDI;
  fdb_doc *doc;
  char bodybuf [1024];
  char metabuf [256];
  char keybuf [256];
  int i;
  void *in_stack_fffffffffffff9a0;
  char *keylen;
  fdb_doc **doc_00;
  fdb_doc *doc_01;
  char local_628 [1024];
  fdb_doc *local_228 [32];
  char local_128 [264];
  int in_stack_ffffffffffffffe0;
  uint uVar1;
  
  doc_01 = (fdb_doc *)0x0;
  str_gen(local_628,0x400);
  uVar1 = in_EDX;
  if (in_EDX == in_ECX) {
    sprintf(local_128,(char *)in_RSI,(ulong)in_EDX);
    sprintf((char *)local_228,"meta%d",(ulong)in_ECX);
    keylen = local_128;
    key = (void *)strlen(local_128);
    doc_00 = local_228;
    strlen((char *)local_228);
    metalen = strlen(local_628);
    fdb_doc_create(doc_00,key,(size_t)keylen,in_stack_fffffffffffff9a0,metalen,(void *)0x104d05,
                   (size_t)doc_01);
    fdb_set(in_RDI,doc_01);
    fdb_doc_free((fdb_doc *)0x104d21);
  }
  else {
    for (; (int)in_EDX <= (int)in_ECX; in_EDX = in_EDX + 1) {
      swap(&(in_RSI->kvs_config).create_if_missing + (int)uVar1,
           &(in_RSI->kvs_config).create_if_missing + (int)in_EDX);
      permute(in_RSI,(char *)CONCAT44(uVar1,in_ECX),in_EDX,in_stack_ffffffffffffffe0);
      swap(&(in_RSI->kvs_config).create_if_missing + (int)uVar1,
           &(in_RSI->kvs_config).create_if_missing + (int)in_EDX);
    }
  }
  return;
}

Assistant:

void permute(fdb_kvs_handle *kv, char *a, int l, int r) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[1024];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 1024);

    if (l == r) {
        sprintf(keybuf, a, l);
        sprintf(metabuf, "meta%d", r);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    } else {
        for (i = l; i <= r; i++) {
            swap((a+l), (a+i));
            permute(kv, a, l+1, r);
            swap((a+l), (a+i)); //backtrack
        }
    }
}